

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

Element __thiscall ftxui::text(ftxui *this,wstring *text)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Element EVar2;
  undefined1 local_48 [24];
  string local_30;
  
  to_string((string *)(local_48 + 0x18),text);
  std::make_shared<ftxui::(anonymous_namespace)::Text,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  uVar1 = local_48._8_8_;
  local_48._8_8_ = 0;
  *(undefined8 *)this = local_48._0_8_;
  *(undefined8 *)(this + 8) = uVar1;
  local_48._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)(local_48 + 0x18));
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element text(std::wstring text) {  // NOLINT
  return std::make_shared<Text>(to_string(text));
}